

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type.cpp
# Opt level: O1

void __thiscall
yactfr::TraceType::TraceType
          (TraceType *this,uint majorVersion,uint minorVersion,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *ns,optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *name,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *uid,TraceEnvironment *env,Up *pktHeaderType,ClockTypeSet *clkTypes,
          DataStreamTypeSet *dsts,Up *attrs)

{
  int iVar1;
  _Head_base<0UL,_yactfr::internal::TraceTypeImpl_*,_false> this_00;
  char *__s1;
  PktProc *this_01;
  ostream *poVar2;
  string local_70;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_50;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_40;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  
  local_48 = ns;
  local_40 = name;
  local_38 = uid;
  this_00._M_head_impl = (TraceTypeImpl *)operator_new(0x168);
  local_70._M_dataplus._M_p =
       (pointer)(pktHeaderType->_M_t).
                super___uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
                ._M_t.
                super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
                .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl;
  (pktHeaderType->_M_t).
  super___uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
  .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl = (StructureType *)0x0;
  local_50._M_head_impl =
       (attrs->_M_t).
       super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
       super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl;
  (attrs->_M_t).
  super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl = (MapItem *)0x0;
  internal::TraceTypeImpl::TraceTypeImpl
            (this_00._M_head_impl,majorVersion,minorVersion,local_48,local_40,local_38,env,
             (Up *)&local_70,clkTypes,dsts,(Up *)&local_50,this);
  (this->_pimpl)._M_t.
  super___uniq_ptr_impl<yactfr::internal::TraceTypeImpl,_std::default_delete<yactfr::internal::TraceTypeImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_yactfr::internal::TraceTypeImpl_*,_std::default_delete<yactfr::internal::TraceTypeImpl>_>
  .super__Head_base<0UL,_yactfr::internal::TraceTypeImpl_*,_false>._M_head_impl =
       this_00._M_head_impl;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_50);
  if ((StructureType *)local_70._M_dataplus._M_p != (StructureType *)0x0) {
    std::default_delete<const_yactfr::StructureType>::operator()
              ((default_delete<const_yactfr::StructureType> *)&local_70,
               (StructureType *)local_70._M_dataplus._M_p);
  }
  __s1 = getenv("YACTFR_DEBUG_PRINT_PROC");
  if (__s1 != (char *)0x0) {
    iVar1 = strcmp(__s1,"1");
    if (iVar1 == 0) {
      this_01 = internal::TraceTypeImpl::pktProc
                          ((this->_pimpl)._M_t.
                           super___uniq_ptr_impl<yactfr::internal::TraceTypeImpl,_std::default_delete<yactfr::internal::TraceTypeImpl>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_yactfr::internal::TraceTypeImpl_*,_std::default_delete<yactfr::internal::TraceTypeImpl>_>
                           .super__Head_base<0UL,_yactfr::internal::TraceTypeImpl_*,_false>.
                           _M_head_impl);
      internal::PktProc::toStr_abi_cxx11_(&local_70,this_01,0);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_70._M_dataplus._M_p,local_70._M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

TraceType::TraceType(const unsigned int majorVersion, const unsigned int minorVersion,
                     boost::optional<std::string> ns, boost::optional<std::string> name,
                     boost::optional<std::string> uid, TraceEnvironment env,
                     StructureType::Up pktHeaderType, ClockTypeSet&& clkTypes,
                     DataStreamTypeSet&& dsts, MapItem::Up attrs) :
    _pimpl {
        std::make_unique<internal::TraceTypeImpl>(majorVersion, minorVersion, std::move(ns),
                                                  std::move(name), std::move(uid), std::move(env),
                                                  std::move(pktHeaderType), std::move(clkTypes),
                                                  std::move(dsts), std::move(attrs), *this)
    }
{
#ifndef NDEBUG
    const auto var = std::getenv("YACTFR_DEBUG_PRINT_PROC");

    if (var && std::strcmp(var, "1") == 0) {
        auto& pktProc = _pimpl->pktProc();
        std::cout << pktProc.toStr(0) << std::endl;
    }
#endif
}